

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

void S_SetListener(SoundListener *listener,AActor *listenactor)

{
  double dVar1;
  double dVar2;
  ushort uVar3;
  
  if (listenactor == (AActor *)0x0) {
    listener->Environment = (ReverbContainer *)0x0;
    (listener->position).X = 0.0;
    (listener->position).Y = 0.0;
    *(undefined8 *)&(listener->position).Z = 0;
    *(undefined8 *)((long)&(listener->velocity).X + 2) = 0;
    *(undefined8 *)((long)&(listener->velocity).Z + 2) = 0;
    return;
  }
  listener->angle = (float)((listenactor->Angles).Yaw.Degrees * 0.017453292519943295);
  (listener->velocity).X = 0.0;
  (listener->velocity).Y = 0.0;
  (listener->velocity).Z = 0.0;
  dVar1 = (listenactor->__Pos).X;
  dVar2 = (listenactor->__Pos).Z;
  (listener->position).Z = (float)(listenactor->__Pos).Y;
  (listener->position).X = (float)dVar1;
  (listener->position).Y = (float)dVar2;
  listener->underwater = listenactor->waterlevel == 3;
  uVar3 = listenactor->Sector->ZoneNumber;
  if (uVar3 < Zones.Count) {
    listener->Environment = Zones.Array[uVar3].Environment;
    listener->valid = true;
    return;
  }
  __assert_fail("Zones.Size() > listenactor->Sector->ZoneNumber",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                ,0x81a,"void S_SetListener(SoundListener &, AActor *)");
}

Assistant:

static void S_SetListener(SoundListener &listener, AActor *listenactor)
{
	if (listenactor != NULL)
	{
		listener.angle = (float)listenactor->Angles.Yaw.Radians();
		/*
		listener.velocity.X = listenactor->vel.x * (TICRATE/65536.f);
		listener.velocity.Y = listenactor->vel.z * (TICRATE/65536.f);
		listener.velocity.Z = listenactor->vel.y * (TICRATE/65536.f);
		*/
		listener.velocity.Zero();
		listener.position = listenactor->SoundPos();
		listener.underwater = listenactor->waterlevel == 3;
		assert(Zones.Size() > listenactor->Sector->ZoneNumber);
		listener.Environment = Zones[listenactor->Sector->ZoneNumber].Environment;
		listener.valid = true;
	}
	else
	{
		listener.angle = 0;
		listener.position.Zero();
		listener.velocity.Zero();
		listener.underwater = false;
		listener.Environment = NULL;
		listener.valid = false;
	}
}